

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,DictionaryPropertyDescriptor<int> *value)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  
  uVar4 = FindEntryWithKey<Js::PropertyRecord_const*>(this,key);
  if (-1 < (int)uVar4) {
    puVar1 = (undefined8 *)(*(long *)(this + 8) + (ulong)uVar4 * 0x20);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    value->flags = (char)uVar2;
    value->Attributes = (char)((ulong)uVar2 >> 8);
    *(short *)&value->field_0x2 = (short)((ulong)uVar2 >> 0x10);
    value->Data = (int)((ulong)uVar2 >> 0x20);
    value->Getter = (int)uVar3;
    value->Setter = (int)((ulong)uVar3 >> 0x20);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }